

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_internal_V2_annotation.cpp
# Opt level: O0

bool __thiscall ON_OBSOLETE_V5_Leader::Transform(ON_OBSOLETE_V5_Leader *this,ON_Xform *xform)

{
  ON_3dPoint p;
  bool bVar1;
  int c;
  ON_2dPoint *pOVar2;
  ON_2dVector OVar3;
  bool local_1d1;
  ON_3dPoint local_1b0;
  undefined1 local_198 [8];
  ON_2dVector v;
  ON_3dPoint local_170;
  ON_3dPoint local_158;
  byte local_139;
  double dStack_138;
  bool bUpdatePoints;
  ON_3dPoint Q;
  undefined1 auStack_118 [8];
  ON_3dPoint P;
  undefined1 local_f8 [8];
  ON_2dPoint q2;
  ON_2dPoint p2;
  ON_2dPointArray q;
  int local_b8;
  int point_count;
  int i;
  undefined1 auStack_a8 [8];
  ON_Plane plane;
  bool local_19;
  bool rc;
  ON_Xform *xform_local;
  ON_OBSOLETE_V5_Leader *this_local;
  
  bVar1 = ON_Xform::IsIdentity(xform,0.0);
  if (bVar1) {
    return bVar1;
  }
  plane.plane_equation.y = (this->super_ON_OBSOLETE_V5_Annotation).m_plane.plane_equation.z;
  plane.plane_equation.z = (this->super_ON_OBSOLETE_V5_Annotation).m_plane.plane_equation.d;
  plane.zaxis.z = (this->super_ON_OBSOLETE_V5_Annotation).m_plane.plane_equation.x;
  plane.plane_equation.x = (this->super_ON_OBSOLETE_V5_Annotation).m_plane.plane_equation.y;
  plane.zaxis.x = (this->super_ON_OBSOLETE_V5_Annotation).m_plane.zaxis.y;
  plane.zaxis.y = (this->super_ON_OBSOLETE_V5_Annotation).m_plane.zaxis.z;
  plane.yaxis.y = (this->super_ON_OBSOLETE_V5_Annotation).m_plane.yaxis.z;
  plane.yaxis.z = (this->super_ON_OBSOLETE_V5_Annotation).m_plane.zaxis.x;
  auStack_a8 = (undefined1  [8])(this->super_ON_OBSOLETE_V5_Annotation).m_plane.origin.x;
  plane.origin.x = (this->super_ON_OBSOLETE_V5_Annotation).m_plane.origin.y;
  plane.origin.y = (this->super_ON_OBSOLETE_V5_Annotation).m_plane.origin.z;
  plane.origin.z = (this->super_ON_OBSOLETE_V5_Annotation).m_plane.xaxis.x;
  plane.xaxis.x = (this->super_ON_OBSOLETE_V5_Annotation).m_plane.xaxis.y;
  plane.xaxis.y = (this->super_ON_OBSOLETE_V5_Annotation).m_plane.xaxis.z;
  plane.xaxis.z = (this->super_ON_OBSOLETE_V5_Annotation).m_plane.yaxis.x;
  plane.yaxis.x = (this->super_ON_OBSOLETE_V5_Annotation).m_plane.yaxis.y;
  local_19 = ON_Plane::Transform((ON_Plane *)auStack_a8,xform);
  if (!local_19) goto LAB_0066b0a6;
  c = ON_SimpleArray<ON_2dPoint>::Count
                (&(this->super_ON_OBSOLETE_V5_Annotation).m_points.super_ON_SimpleArray<ON_2dPoint>)
  ;
  ON_2dPointArray::ON_2dPointArray((ON_2dPointArray *)&p2.y,c);
  local_139 = 0;
  local_b8 = 0;
  while( true ) {
    local_1d1 = false;
    if (local_b8 < c) {
      local_1d1 = local_19;
    }
    if (local_1d1 == false) break;
    pOVar2 = ON_SimpleArray<ON_2dPoint>::operator[]
                       (&(this->super_ON_OBSOLETE_V5_Annotation).m_points.
                         super_ON_SimpleArray<ON_2dPoint>,local_b8);
    q2.y = pOVar2->x;
    p2.x = pOVar2->y;
    ON_Plane::PointAt(&local_158,&(this->super_ON_OBSOLETE_V5_Annotation).m_plane,q2.y,p2.x);
    P.y = local_158.z;
    auStack_118 = (undefined1  [8])local_158.x;
    P.x = local_158.y;
    ON_Xform::operator*(&local_170,xform,(ON_3dPoint *)auStack_118);
    Q.y = local_170.z;
    dStack_138 = local_170.x;
    Q.x = local_170.y;
    v.y = local_170.x;
    p.y = local_170.y;
    p.x = local_170.x;
    p.z = local_170.z;
    bVar1 = ON_Plane::ClosestPointTo((ON_Plane *)auStack_a8,p,(double *)local_f8,&q2.x);
    if (!bVar1) {
      local_19 = false;
    }
    if (1.490116119385e-08 < ABS(q2.y - (double)local_f8)) {
      local_139 = 1;
    }
    else {
      local_f8 = (undefined1  [8])q2.y;
    }
    if (1.490116119385e-08 < ABS(p2.x - q2.x)) {
      local_139 = 1;
    }
    else {
      q2.x = p2.x;
    }
    ON_SimpleArray<ON_2dPoint>::Append((ON_SimpleArray<ON_2dPoint> *)&p2.y,(ON_2dPoint *)local_f8);
    local_b8 = local_b8 + 1;
  }
  if (local_19 != false) {
    ON_Geometry::Transform((ON_Geometry *)this,xform);
    memcpy(&(this->super_ON_OBSOLETE_V5_Annotation).m_plane,auStack_a8,0x80);
    if ((local_139 & 1) != 0) {
      ON_2dPointArray::operator=
                (&(this->super_ON_OBSOLETE_V5_Annotation).m_points,(ON_2dPointArray *)&p2.y);
    }
    pOVar2 = ON_SimpleArray<ON_2dPoint>::operator[]
                       (&(this->super_ON_OBSOLETE_V5_Annotation).m_points.
                         super_ON_SimpleArray<ON_2dPoint>,0);
    if ((pOVar2->x == 0.0) && (!NAN(pOVar2->x))) {
      pOVar2 = ON_SimpleArray<ON_2dPoint>::operator[]
                         (&(this->super_ON_OBSOLETE_V5_Annotation).m_points.
                           super_ON_SimpleArray<ON_2dPoint>,0);
      if ((pOVar2->y == 0.0) && (!NAN(pOVar2->y))) goto LAB_0066b09a;
    }
    pOVar2 = ON_SimpleArray<ON_2dPoint>::operator[]
                       (&(this->super_ON_OBSOLETE_V5_Annotation).m_points.
                         super_ON_SimpleArray<ON_2dPoint>,0);
    ON_2dVector::ON_2dVector((ON_2dVector *)local_198,pOVar2);
    bVar1 = ON_2dVector::IsZero((ON_2dVector *)local_198);
    if (!bVar1) {
      ON_Plane::PointAt(&local_1b0,&(this->super_ON_OBSOLETE_V5_Annotation).m_plane,
                        (double)local_198,v.x);
      (this->super_ON_OBSOLETE_V5_Annotation).m_plane.origin.z = local_1b0.z;
      (this->super_ON_OBSOLETE_V5_Annotation).m_plane.origin.x = local_1b0.x;
      (this->super_ON_OBSOLETE_V5_Annotation).m_plane.origin.y = local_1b0.y;
      ON_Plane::UpdateEquation(&(this->super_ON_OBSOLETE_V5_Annotation).m_plane);
      OVar3 = ON_2dVector::operator-((ON_2dVector *)local_198);
      v.x = OVar3.y;
      local_198 = (undefined1  [8])OVar3.x;
      for (local_b8 = 1; local_b8 < c; local_b8 = local_b8 + 1) {
        pOVar2 = ON_SimpleArray<ON_2dPoint>::operator[]
                           (&(this->super_ON_OBSOLETE_V5_Annotation).m_points.
                             super_ON_SimpleArray<ON_2dPoint>,local_b8);
        ON_2dPoint::operator+=(pOVar2,(ON_2dVector *)local_198);
      }
      pOVar2 = ON_SimpleArray<ON_2dPoint>::operator[]
                         (&(this->super_ON_OBSOLETE_V5_Annotation).m_points.
                           super_ON_SimpleArray<ON_2dPoint>,0);
      ON_2dPoint::Set(pOVar2,0.0,0.0);
    }
  }
LAB_0066b09a:
  ON_2dPointArray::~ON_2dPointArray((ON_2dPointArray *)&p2.y);
LAB_0066b0a6:
  ON_Plane::~ON_Plane((ON_Plane *)auStack_a8);
  return local_19;
}

Assistant:

bool ON_OBSOLETE_V5_Leader::Transform( const ON_Xform& xform )
{
  bool rc = xform.IsIdentity();
  if ( !rc)
  {
    ON_Plane plane = m_plane;
    rc = plane.Transform(xform);
    if ( rc )
    {
      int i;
      const int point_count =  m_points.Count();
      ON_2dPointArray q(point_count);
      ON_2dPoint p2, q2;
      ON_3dPoint P, Q;
      bool bUpdatePoints = false;
      for ( i = 0; i < point_count && rc; i++ )
      {
        p2 = m_points[i];
        P = m_plane.PointAt( p2.x, p2.y );
        Q = xform*P;
        if( !plane.ClosestPointTo(Q,&q2.x,&q2.y) )
          rc = false;
        if ( fabs(p2.x - q2.x) <= ON_SQRT_EPSILON )
          q2.x = p2.x;
        else
          bUpdatePoints = true;
        if ( fabs(p2.y - q2.y) <= ON_SQRT_EPSILON )
          q2.y = p2.y;
        else
          bUpdatePoints = true;
        q.Append(q2);
      }

      if(rc)
      {
        ON_Geometry::Transform(xform);
        m_plane = plane;

        if ( bUpdatePoints )
          m_points = q;

        if ( m_points[0].x != 0.0 || m_points[0].y != 0.0 )
        {
          ON_2dVector v = m_points[0];
          if ( !v.IsZero() )
          {
            m_plane.origin = m_plane.PointAt(v.x,v.y);
            m_plane.UpdateEquation();
            v = -v;
            for ( i = 1; i < point_count; i++ )
            {
              m_points[i] += v;
            }
            m_points[0].Set(0.0,0.0);
          }
        }
      }
    }
  }
  return rc;
}